

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3SegReaderIncrRead(Fts3SegReader *pReader)

{
  int iVar1;
  int local_1c;
  int rc;
  int nRead;
  Fts3SegReader *pReader_local;
  
  if (pReader->nNode - pReader->nPopulate < 0x1000) {
    local_1c = pReader->nNode - pReader->nPopulate;
  }
  else {
    local_1c = 0x1000;
  }
  iVar1 = sqlite3_blob_read(pReader->pBlob,pReader->aNode + pReader->nPopulate,local_1c,
                            pReader->nPopulate);
  if (iVar1 == 0) {
    pReader->nPopulate = local_1c + pReader->nPopulate;
    memset(pReader->aNode + pReader->nPopulate,0,0x14);
    if (pReader->nPopulate == pReader->nNode) {
      sqlite3_blob_close(pReader->pBlob);
      pReader->pBlob = (sqlite3_blob *)0x0;
      pReader->nPopulate = 0;
    }
  }
  return iVar1;
}

Assistant:

static int fts3SegReaderIncrRead(Fts3SegReader *pReader){
  int nRead;                      /* Number of bytes to read */
  int rc;                         /* Return code */

  nRead = MIN(pReader->nNode - pReader->nPopulate, FTS3_NODE_CHUNKSIZE);
  rc = sqlite3_blob_read(
      pReader->pBlob, 
      &pReader->aNode[pReader->nPopulate],
      nRead,
      pReader->nPopulate
  );

  if( rc==SQLITE_OK ){
    pReader->nPopulate += nRead;
    memset(&pReader->aNode[pReader->nPopulate], 0, FTS3_NODE_PADDING);
    if( pReader->nPopulate==pReader->nNode ){
      sqlite3_blob_close(pReader->pBlob);
      pReader->pBlob = 0;
      pReader->nPopulate = 0;
    }
  }
  return rc;
}